

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-raster.c
# Opt level: O3

void gray_render_conic(PWorker worker,PVG_FT_Vector *control,PVG_FT_Vector *to)

{
  bool bVar1;
  ulong uVar2;
  long *plVar3;
  long *plVar4;
  uint uVar5;
  long in_RCX;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  long in_R8;
  long lVar10;
  long lVar11;
  PVG_FT_Vector bez_stack [33];
  long local_228;
  long local_220 [65];
  
  local_228 = in_RCX * 4;
  local_220[0] = in_R8 * 4;
  local_220[1] = (long)control * 4;
  local_220[2] = (long)to * 4;
  local_220[3] = worker->x;
  local_220[4] = worker->y;
  lVar9 = worker->max_ey;
  if (((in_R8 >> 6 < lVar9) || (local_220[4] >> 8 < lVar9 || (long)to >> 6 < lVar9)) &&
     (lVar9 = worker->min_ey,
     lVar9 <= local_220[4] >> 8 || (lVar9 <= (long)to >> 6 || lVar9 <= in_R8 >> 6))) {
    uVar6 = local_228 + (long)control * -8 + worker->x;
    uVar8 = -uVar6;
    if (0 < (long)uVar6) {
      uVar8 = uVar6;
    }
    uVar2 = local_220[0] + (long)to * -8 + local_220[4];
    uVar6 = -uVar2;
    if (0 < (long)uVar2) {
      uVar6 = uVar2;
    }
    if (uVar6 < uVar8) {
      uVar6 = uVar8;
    }
    uVar7 = 1;
    plVar3 = &local_228;
    if (0x40 < uVar6) {
      do {
        uVar7 = uVar7 * 2;
        bVar1 = 0x103 < uVar6;
        plVar3 = &local_228;
        uVar6 = uVar6 >> 2;
      } while (bVar1);
    }
    do {
      lVar9 = *plVar3;
      if ((uVar7 & 1) == 0) {
        uVar5 = 1;
        plVar4 = plVar3;
        do {
          plVar3 = plVar4 + 4;
          plVar4[8] = plVar4[4];
          lVar11 = (plVar4[4] + plVar4[2]) / 2;
          plVar4[6] = lVar11;
          lVar9 = (lVar9 + plVar4[2]) / 2;
          plVar4[2] = lVar9;
          lVar9 = (lVar9 + lVar11) / 2;
          plVar4[4] = lVar9;
          plVar4[9] = plVar4[5];
          lVar10 = (plVar4[5] + plVar4[3]) / 2;
          plVar4[7] = lVar10;
          lVar11 = (plVar4[3] + plVar4[1]) / 2;
          plVar4[3] = lVar11;
          plVar4[5] = (lVar11 + lVar10) / 2;
          uVar5 = uVar5 * 2;
          plVar4 = plVar3;
        } while ((uVar5 & uVar7) == 0);
      }
      gray_render_line(worker,lVar9,plVar3[1]);
      uVar7 = uVar7 - 1;
      plVar3 = plVar3 + -4;
    } while (uVar7 != 0);
  }
  else {
    worker->x = local_228;
    worker->y = local_220[0];
  }
  return;
}

Assistant:

static void
  gray_render_conic( RAS_ARG_ const PVG_FT_Vector*  control,
                              const PVG_FT_Vector*  to )
  {
    PVG_FT_Vector   bez_stack[16 * 2 + 1];  /* enough to accommodate bisections */
    PVG_FT_Vector*  arc = bez_stack;
    TPos        dx, dy;
    int         draw, split;


    arc[0].x = UPSCALE( to->x );
    arc[0].y = UPSCALE( to->y );
    arc[1].x = UPSCALE( control->x );
    arc[1].y = UPSCALE( control->y );
    arc[2].x = ras.x;
    arc[2].y = ras.y;

    /* short-cut the arc that crosses the current band */
    if ( ( TRUNC( arc[0].y ) >= ras.max_ey &&
           TRUNC( arc[1].y ) >= ras.max_ey &&
           TRUNC( arc[2].y ) >= ras.max_ey ) ||
         ( TRUNC( arc[0].y ) <  ras.min_ey &&
           TRUNC( arc[1].y ) <  ras.min_ey &&
           TRUNC( arc[2].y ) <  ras.min_ey ) )
    {
      ras.x = arc[0].x;
      ras.y = arc[0].y;
      return;
    }

    dx = PVG_FT_ABS( arc[2].x + arc[0].x - 2 * arc[1].x );
    dy = PVG_FT_ABS( arc[2].y + arc[0].y - 2 * arc[1].y );
    if ( dx < dy )
      dx = dy;

    /* We can calculate the number of necessary bisections because  */
    /* each bisection predictably reduces deviation exactly 4-fold. */
    /* Even 32-bit deviation would vanish after 16 bisections.      */
    draw = 1;
    while ( dx > ONE_PIXEL / 4 )
    {
      dx >>= 2;
      draw <<= 1;
    }

    /* We use decrement counter to count the total number of segments */
    /* to draw starting from 2^level. Before each draw we split as    */
    /* many times as there are trailing zeros in the counter.         */
    do
    {
      split = 1;
      while ( ( draw & split ) == 0 )
      {
        gray_split_conic( arc );
        arc += 2;
        split <<= 1;
      }

      gray_render_line( RAS_VAR_ arc[0].x, arc[0].y );
      arc -= 2;

    } while ( --draw );
  }